

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O3

Vector<float> * __thiscall Vector<float>::operator=(Vector<float> *this,float *val)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  long *plVar5;
  size_t sVar6;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  long *local_38;
  long local_30;
  long local_28 [2];
  long lVar11;
  
  auVar4 = _DAT_014d28c0;
  uVar2 = this->num_elts;
  if ((ulong)uVar2 == 0) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,
               "Vector< T >& Vector< T >::operator = (const T& val), unallocated vector","");
    plVar5 = local_38;
    if (local_30 != 0) {
      if (local_38 == (long *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1a342a8);
      }
      else {
        sVar6 = strlen((char *)local_38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)plVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
      std::ostream::put(-0x58);
      std::ostream::flush();
    }
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
  }
  else if (0 < (int)uVar2) {
    pfVar3 = this->ptr_to_data;
    fVar1 = *val;
    lVar7 = (ulong)uVar2 - 1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar8 = auVar8 ^ _DAT_014d28c0;
    auVar10 = _DAT_014d2b10;
    auVar12 = _DAT_014d28b0;
    do {
      auVar13 = auVar12 ^ auVar4;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar9 && auVar8._0_4_ < auVar13._0_4_ || iVar9 < auVar13._4_4_)
                & 1)) {
        *(float *)((long)pfVar3 + lVar7) = fVar1;
      }
      if ((auVar13._12_4_ != auVar8._12_4_ || auVar13._8_4_ <= auVar8._8_4_) &&
          auVar13._12_4_ <= auVar8._12_4_) {
        *(float *)((long)pfVar3 + lVar7 + 4) = fVar1;
      }
      auVar13 = auVar10 ^ auVar4;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar9 && (iVar14 != iVar9 || auVar13._0_4_ <= auVar8._0_4_)) {
        *(float *)((long)pfVar3 + lVar7 + 8) = fVar1;
        *(float *)((long)pfVar3 + lVar7 + 0xc) = fVar1;
      }
      lVar11 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar11 + 4;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar11 + 4;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uVar2 + 3 >> 2) << 4 != lVar7);
  }
  return this;
}

Assistant:

Vector< T >& Vector< T >::operator = (const T& val)
{
  if (num_elts != 0)
    for (int i=0; i<num_elts; ++i)
      ptr_to_data[i] = val;
  else error("Vector< T >& Vector< T >::operator = (const T& val), unallocated vector");

  return *this;
}